

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_buffer.c
# Opt level: O2

void test_cio_write_buffer_splice_empty_list(void)

{
  cio_write_buffer list_to_append;
  cio_write_buffer local_60;
  cio_write_buffer wbh;
  
  wbh.next = &wbh;
  wbh.data.head.q_len = 0;
  wbh.data.element.length = 0;
  local_60.data.head.q_len = 0;
  local_60.data.element.length = 0;
  wbh.prev = wbh.next;
  cio_write_buffer_queue_tail(wbh.next,&local_60);
  UnityAssertEqualNumber
            (1,wbh.data.head.q_len,"Number of elements in write buffer not correct!",0x10b,
             UNITY_DISPLAY_STYLE_INT);
  list_to_append.next = &list_to_append;
  list_to_append.data.head.q_len = 0;
  list_to_append.data.element.length = 0;
  list_to_append.prev = list_to_append.next;
  UnityAssertEqualNumber
            (1,wbh.data.head.q_len,"Number of elements in write buffer not correct!",0x110,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_cio_write_buffer_splice_empty_list(void)
{
	struct cio_write_buffer wbh;
	cio_write_buffer_head_init(&wbh);

	struct cio_write_buffer wbe;
	cio_write_buffer_element_init(&wbe, NULL, 0);
	cio_write_buffer_queue_tail(&wbh, &wbe);
	TEST_ASSERT_EQUAL_MESSAGE(1, cio_write_buffer_get_num_buffer_elements(&wbh), "Number of elements in write buffer not correct!");

	struct cio_write_buffer list_to_append;
	cio_write_buffer_head_init(&list_to_append);
	cio_write_buffer_splice(&list_to_append, &wbh);
	TEST_ASSERT_EQUAL_MESSAGE(1, cio_write_buffer_get_num_buffer_elements(&wbh), "Number of elements in write buffer not correct!");
}